

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::java::HasRequiredFields
               (Descriptor *type,
               unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *already_seen)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  JavaType JVar4;
  size_type sVar5;
  undefined1 uVar6;
  Descriptor *in_RSI;
  Descriptor *in_RDI;
  pair<std::__detail::_Node_iterator<const_google::protobuf::Descriptor_*,_true,_false>,_bool> pVar7
  ;
  FieldDescriptor *field;
  FieldDescriptor *in_stack_00000018;
  int i;
  key_type *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  value_type *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int index;
  undefined7 in_stack_ffffffffffffffe1;
  bool local_1;
  
  sVar5 = std::
          unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::count((unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8);
  if (sVar5 == 0) {
    pVar7 = std::
            unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ::insert((unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
    uVar6 = pVar7.second;
    iVar2 = Descriptor::extension_range_count(in_RDI);
    if (iVar2 < 1) {
      iVar2 = 0;
      while (index = iVar2, iVar3 = Descriptor::field_count(in_RDI), iVar2 < iVar3) {
        Descriptor::field(in_RDI,index);
        bVar1 = FieldDescriptor::is_required((FieldDescriptor *)0x45c82f);
        if (bVar1) {
          return true;
        }
        JVar4 = GetJavaType(in_stack_00000018);
        if (JVar4 == JAVATYPE_MESSAGE) {
          FieldDescriptor::message_type
                    ((FieldDescriptor *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
          bVar1 = HasRequiredFields(in_RSI,(unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                            *)CONCAT71(in_stack_ffffffffffffffe1,uVar6));
          if (bVar1) {
            return true;
          }
        }
        iVar2 = index + 1;
      }
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HasRequiredFields(const Descriptor* type,
                       std::unordered_set<const Descriptor*>* already_seen) {
  if (already_seen->count(type) > 0) {
    // The type is already in cache.  This means that either:
    // a. The type has no required fields.
    // b. We are in the midst of checking if the type has required fields,
    //    somewhere up the stack.  In this case, we know that if the type
    //    has any required fields, they'll be found when we return to it,
    //    and the whole call to HasRequiredFields() will return true.
    //    Therefore, we don't have to check if this type has required fields
    //    here.
    return false;
  }
  already_seen->insert(type);

  // If the type has extensions, an extension with message type could contain
  // required fields, so we have to be conservative and assume such an
  // extension exists.
  if (type->extension_range_count() > 0) return true;

  for (int i = 0; i < type->field_count(); i++) {
    const FieldDescriptor* field = type->field(i);
    if (field->is_required()) {
      return true;
    }
    if (GetJavaType(field) == JAVATYPE_MESSAGE) {
      if (HasRequiredFields(field->message_type(), already_seen)) {
        return true;
      }
    }
  }

  return false;
}